

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::~BinaryRegistryReader(BinaryRegistryReader *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  de::details::
  UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  ::reset(&(this->m_binaryIndex).
           super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
         );
  pcVar1 = (this->m_srcPath)._M_dataplus._M_p;
  paVar2 = &(this->m_srcPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

BinaryRegistryReader::~BinaryRegistryReader (void)
{
}